

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

void __thiscall UnifiedRegex::Program::Print(Program *this,DebugWriter *w)

{
  uint uVar1;
  char16_t *pcVar2;
  uchar *puVar3;
  code *pcVar4;
  byte bVar5;
  bool bVar6;
  int iVar7;
  char16_t **ppcVar8;
  uchar **ppuVar9;
  undefined4 *puVar10;
  OctoquadMatcher *this_00;
  Label local_1338;
  Label local_1310;
  Label local_12e8;
  Label local_12c0;
  Label local_1298;
  Label local_1270;
  Label local_1248;
  Label local_1220;
  Label local_11f8;
  Label local_11d0;
  Label local_11a8;
  Label local_1180;
  Label local_1158;
  Label local_1130;
  Label local_1108;
  Label local_10e0;
  Label local_10b8;
  Label local_1090;
  Label local_1068;
  Label local_1040;
  Label local_1018;
  Label local_ff0;
  Label local_fc8;
  Label local_fa0;
  Label local_f78;
  Label local_f50;
  Label local_f28;
  Label local_f00;
  Label local_ed8;
  Label local_eb0;
  Label local_e88;
  Label local_e60;
  Label local_e38;
  Label local_e10;
  Label local_de8;
  Label local_dc0;
  Label local_d98;
  Label local_d70;
  Label local_d48;
  Label local_d20;
  Label local_cf8;
  Label local_cd0;
  Label local_ca8;
  Label local_c80;
  Label local_c58;
  Label local_c30;
  Label local_c08;
  Label local_be0;
  Label local_bb8;
  Label local_b90;
  Label local_b68;
  Label local_b40;
  Label local_b18;
  Label local_af0;
  Label local_ac8;
  Label local_aa0;
  Label local_a78;
  Label local_a50;
  Label local_a28;
  Label local_a00;
  Label local_9d8;
  Label local_9b0;
  Label local_988;
  Label local_960;
  Label local_938;
  Label local_910;
  Label local_8e8;
  Label local_8c0;
  Label local_898;
  Label local_870;
  Label local_848;
  Label local_820;
  Label local_7f8;
  Label local_7d0;
  Label local_7a8;
  Label local_780;
  Label local_758;
  Label local_730;
  Label local_708;
  Label local_6e0;
  Label local_6b8;
  Label local_690;
  Label local_668;
  Label local_640;
  Label local_618;
  Label local_5f0;
  Label local_5c8;
  Label local_5a0;
  Label local_578;
  Label local_550;
  Label local_528;
  Label local_500;
  Label local_4d8;
  Label local_4b0;
  Label local_488;
  Label local_460;
  Label local_438;
  Label local_410;
  Label local_3e8;
  Label local_3c0;
  EndAssertionInst *actualInst_99;
  BeginAssertionInst *actualInst_98;
  TryMatchSetInst *actualInst_97;
  TryIfSetInst *actualInst_96;
  TryMatchCharInst *actualInst_95;
  TryIfCharInst *actualInst_94;
  TryInst *actualInst_93;
  ChompSetBoundedGroupLastCharInst *actualInst_92;
  ChompSetBoundedInst *actualInst_91;
  ChompCharBoundedInst *actualInst_90;
  ChompSetGroupInst<(UnifiedRegex::ChompMode)1> *actualInst_89;
  ChompSetGroupInst<(UnifiedRegex::ChompMode)0> *actualInst_88;
  ChompCharGroupInst<(UnifiedRegex::ChompMode)1> *actualInst_87;
  ChompCharGroupInst<(UnifiedRegex::ChompMode)0> *actualInst_86;
  ChompSetInst<(UnifiedRegex::ChompMode)1> *actualInst_85;
  ChompSetInst<(UnifiedRegex::ChompMode)0> *actualInst_84;
  ChompCharInst<(UnifiedRegex::ChompMode)1> *actualInst_83;
  ChompCharInst<(UnifiedRegex::ChompMode)0> *actualInst_82;
  RepeatGreedyLoopNoBacktrackInst *actualInst_81;
  BeginGreedyLoopNoBacktrackInst *actualInst_80;
  RepeatLoopFixedGroupLastIterationInst *actualInst_79;
  BeginLoopFixedGroupLastIterationInst *actualInst_78;
  LoopSetWithFollowFirstInst *actualInst_77;
  LoopSetInst *actualInst_76;
  RepeatLoopFixedInst *actualInst_75;
  BeginLoopFixedInst *actualInst_74;
  RepeatLoopIfSetInst *actualInst_73;
  RepeatLoopIfCharInst *actualInst_72;
  BeginLoopIfSetInst *actualInst_71;
  BeginLoopIfCharInst *actualInst_70;
  RepeatLoopInst *actualInst_69;
  BeginLoopInst *actualInst_68;
  DefineGroupFixedInst *actualInst_67;
  EndDefineGroupInst *actualInst_66;
  BeginDefineGroupInst *actualInst_65;
  MatchGroupInst *actualInst_64;
  SyncToLiteralsAndBackupInst *actualInst_63;
  SyncToLiteralEquivTrivialLastPatCharAndBackupInst *actualInst_62;
  SyncToLiteralEquivAndBackupInst *actualInst_61;
  SyncToLinearLiteralAndBackupInst *actualInst_60;
  SyncToLiteralAndBackupInst *actualInst_59;
  SyncToChar2LiteralAndBackupInst *actualInst_58;
  SyncToSetAndBackupInst<true> *actualInst_57;
  SyncToSetAndBackupInst<false> *actualInst_56;
  SyncToCharAndBackupInst *actualInst_55;
  SyncToLiteralEquivTrivialLastPatCharAndConsumeInst *actualInst_54;
  SyncToLiteralEquivAndConsumeInst *actualInst_53;
  SyncToLinearLiteralAndConsumeInst *actualInst_52;
  SyncToLiteralAndConsumeInst *actualInst_51;
  SyncToChar2LiteralAndConsumeInst *actualInst_50;
  SyncToSetAndConsumeInst<true> *actualInst_49;
  SyncToSetAndConsumeInst<false> *actualInst_48;
  SyncToChar2SetAndConsumeInst *actualInst_47;
  SyncToCharAndConsumeInst *actualInst_46;
  SyncToLiteralEquivTrivialLastPatCharAndContinueInst *actualInst_45;
  SyncToLiteralEquivAndContinueInst *actualInst_44;
  SyncToLinearLiteralAndContinueInst *actualInst_43;
  SyncToLiteralAndContinueInst *actualInst_42;
  SyncToChar2LiteralAndContinueInst *actualInst_41;
  SyncToSetAndContinueInst<true> *actualInst_40;
  SyncToSetAndContinueInst<false> *actualInst_39;
  SyncToChar2SetAndContinueInst *actualInst_38;
  SyncToCharAndContinueInst *actualInst_37;
  OptMatchSetInst *actualInst_36;
  OptMatchCharInst *actualInst_35;
  MatchTrieInst *actualInst_34;
  MatchLiteralEquivInst *actualInst_33;
  MatchLiteralInst *actualInst_32;
  MatchSetInst<true> *actualInst_31;
  MatchSetInst<false> *actualInst_30;
  MatchChar4Inst *actualInst_29;
  MatchChar3Inst *actualInst_28;
  MatchChar2Inst *actualInst_27;
  MatchCharInst *actualInst_26;
  WordBoundaryTestInst<false> *actualInst_25;
  WordBoundaryTestInst<true> *actualInst_24;
  EOLTestInst *actualInst_23;
  BOLTestInst *actualInst_22;
  EOITestInst<false> *actualInst_21;
  EOITestInst<true> *actualInst_20;
  BOITestInst<false> *actualInst_19;
  BOITestInst<true> *actualInst_18;
  SwitchAndConsume24Inst *actualInst_17;
  SwitchAndConsume16Inst *actualInst_16;
  SwitchAndConsume8Inst *actualInst_15;
  SwitchAndConsume4Inst *actualInst_14;
  SwitchAndConsume2Inst *actualInst_13;
  Switch24Inst *actualInst_12;
  Switch16Inst *actualInst_11;
  Switch8Inst *actualInst_10;
  Switch4Inst *actualInst_9;
  Switch2Inst *actualInst_8;
  MatchSetOrJumpInst *actualInst_7;
  JumpIfNotSetInst *actualInst_6;
  MatchCharOrJumpInst *actualInst_5;
  JumpIfNotCharInst *actualInst_4;
  JumpInst *actualInst_3;
  SuccInst *actualInst_2;
  FailInst *actualInst_1;
  NopInst *actualInst;
  Inst *inst;
  SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *pSStack_50;
  int i_1;
  uint8 *curr;
  uint8 *instsLim;
  ulong uStack_38;
  char16 c;
  size_t i;
  size_t litbufLen;
  char16 *litbuf;
  bool isBaselineMode;
  DebugWriter *w_local;
  Program *this_local;
  
  bVar5 = DAT_01e9e260 & 1;
  DebugWriter::PrintEOL(w,L"Program {");
  DebugWriter::Indent(w);
  ppcVar8 = Memory::PointerValue<char16_t>(&this->source);
  DebugWriter::PrintEOL(w,L"source:       %s",*ppcVar8);
  DebugWriter::Print(w,L"litbuf:       ");
  ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                      ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
  pcVar2 = *ppcVar8;
  i = 0;
  if (pcVar2 == (char16_t *)0x0) {
    DebugWriter::PrintEOL(w,L"<NONE>");
  }
  else {
    i = (size_t)(this->rep).insts.litbufLen;
    for (uStack_38 = 0; uStack_38 < i; uStack_38 = uStack_38 + 1) {
      DebugWriter::PrintEscapedChar(w,pcVar2[uStack_38]);
    }
    DebugWriter::PrintEOL(w,L"");
  }
  DebugWriter::PrintEOL(w,L"litbufLen:    %u",i);
  DebugWriter::Print(w,L"flags:        ");
  if ((this->flags & GlobalRegexFlag) != NoRegexFlags) {
    DebugWriter::Print(w,L"global ");
  }
  if ((this->flags & MultilineRegexFlag) != NoRegexFlags) {
    DebugWriter::Print(w,L"multiline ");
  }
  if ((this->flags & IgnoreCaseRegexFlag) != NoRegexFlags) {
    DebugWriter::Print(w,L"ignorecase ");
  }
  if ((this->flags & DotAllRegexFlag) != NoRegexFlags) {
    DebugWriter::Print(w,L"dotAll ");
  }
  if ((this->flags & UnicodeRegexFlag) != NoRegexFlags) {
    DebugWriter::Print(w,L"unicode ");
  }
  if ((this->flags & StickyRegexFlag) != NoRegexFlags) {
    DebugWriter::Print(w,L"sticky ");
  }
  DebugWriter::EOL(w);
  DebugWriter::PrintEOL(w,L"numGroups:    %d",(ulong)this->numGroups);
  DebugWriter::PrintEOL(w,L"numLoops:     %d",(ulong)(uint)this->numLoops);
  switch(this->tag) {
  case InstructionsTag:
  case BOIInstructionsTag:
    DebugWriter::PrintEOL(w,L"instructions: {");
    DebugWriter::Indent(w);
    if (this->tag == BOIInstructionsTag) {
      DebugWriter::PrintEOL(w,L"       BOITest(hardFail: true)");
    }
    ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                        ((WriteBarrierPtr *)&(this->rep).insts);
    puVar3 = *ppuVar9;
    uVar1 = (this->rep).insts.instsLen;
    ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                        ((WriteBarrierPtr *)&(this->rep).insts);
    pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)*ppuVar9;
    inst._4_4_ = 0;
    while (pSStack_50 !=
           (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)(puVar3 + uVar1)) {
      iVar7 = (int)pSStack_50;
      switch((pSStack_50->super_Inst).tag) {
      case Nop:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_3c0 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_3c0 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = NopInst::Print((NopInst *)pSStack_50,w,local_3c0,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case Fail:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_3e8 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_3e8 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = FailInst::Print((FailInst *)pSStack_50,w,local_3e8,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case Succ:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_410 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_410 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = SuccInst::Print((SuccInst *)pSStack_50,w,local_410,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case Jump:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_438 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_438 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = JumpInst::Print((JumpInst *)pSStack_50,w,local_438,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case JumpIfNotChar:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_460 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_460 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = JumpIfNotCharInst::Print((JumpIfNotCharInst *)pSStack_50,w,local_460,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case MatchCharOrJump:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_488 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_488 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = MatchCharOrJumpInst::Print((MatchCharOrJumpInst *)pSStack_50,w,local_488,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case JumpIfNotSet:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_4b0 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_4b0 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = JumpIfNotSetInst::Print((JumpIfNotSetInst *)pSStack_50,w,local_4b0,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case MatchSetOrJump:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_4d8 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_4d8 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = MatchSetOrJumpInst::Print((MatchSetOrJumpInst *)pSStack_50,w,local_4d8,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case Switch2:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_500 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_500 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = Switch2Inst::Print((Switch2Inst *)pSStack_50,w,local_500,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case Switch4:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_528 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_528 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = Switch4Inst::Print((Switch4Inst *)pSStack_50,w,local_528,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case Switch8:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_550 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_550 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = Switch8Inst::Print((Switch8Inst *)pSStack_50,w,local_550,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case Switch16:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_578 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_578 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = Switch16Inst::Print((Switch16Inst *)pSStack_50,w,local_578,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case Switch24:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_5a0 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_5a0 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = Switch24Inst::Print((Switch24Inst *)pSStack_50,w,local_5a0,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case SwitchAndConsume2:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_5c8 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_5c8 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = SwitchAndConsume2Inst::Print
                          ((SwitchAndConsume2Inst *)pSStack_50,w,local_5c8,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case SwitchAndConsume4:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_5f0 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_5f0 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = SwitchAndConsume4Inst::Print
                          ((SwitchAndConsume4Inst *)pSStack_50,w,local_5f0,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case SwitchAndConsume8:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_618 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_618 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = SwitchAndConsume8Inst::Print
                          ((SwitchAndConsume8Inst *)pSStack_50,w,local_618,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case SwitchAndConsume16:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_640 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_640 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = SwitchAndConsume16Inst::Print
                          ((SwitchAndConsume16Inst *)pSStack_50,w,local_640,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case SwitchAndConsume24:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_668 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_668 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = SwitchAndConsume24Inst::Print
                          ((SwitchAndConsume24Inst *)pSStack_50,w,local_668,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case BOIHardFailTest:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_690 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_690 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = BOITestInst<true>::Print((BOITestInst<true> *)pSStack_50,w,local_690,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case BOITest:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_6b8 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_6b8 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = BOITestInst<false>::Print((BOITestInst<false> *)pSStack_50,w,local_6b8,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case EOIHardFailTest:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_6e0 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_6e0 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = EOITestInst<true>::Print((EOITestInst<true> *)pSStack_50,w,local_6e0,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case EOITest:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_708 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_708 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = EOITestInst<false>::Print((EOITestInst<false> *)pSStack_50,w,local_708,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case BOLTest:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_730 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_730 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = BOLTestInst::Print((BOLTestInst *)pSStack_50,w,local_730,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case EOLTest:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_758 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_758 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = EOLTestInst::Print((EOLTestInst *)pSStack_50,w,local_758,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case NegatedWordBoundaryTest:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_780 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_780 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = WordBoundaryTestInst<true>::Print
                          ((WordBoundaryTestInst<true> *)pSStack_50,w,local_780,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case WordBoundaryTest:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_7a8 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_7a8 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = WordBoundaryTestInst<false>::Print
                          ((WordBoundaryTestInst<false> *)pSStack_50,w,local_7a8,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case MatchChar:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_7d0 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_7d0 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = MatchCharInst::Print((MatchCharInst *)pSStack_50,w,local_7d0,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case MatchChar2:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_7f8 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_7f8 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = MatchChar2Inst::Print((MatchChar2Inst *)pSStack_50,w,local_7f8,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case MatchChar3:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_820 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_820 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = MatchChar3Inst::Print((MatchChar3Inst *)pSStack_50,w,local_820,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case MatchChar4:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_848 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_848 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = MatchChar4Inst::Print((MatchChar4Inst *)pSStack_50,w,local_848,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case MatchSet:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_870 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_870 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = MatchSetInst<false>::Print((MatchSetInst<false> *)pSStack_50,w,local_870,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case MatchNegatedSet:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_898 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_898 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = MatchSetInst<true>::Print((MatchSetInst<true> *)pSStack_50,w,local_898,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case MatchLiteral:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_8c0 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_8c0 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = MatchLiteralInst::Print((MatchLiteralInst *)pSStack_50,w,local_8c0,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case MatchLiteralEquiv:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_8e8 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_8e8 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = MatchLiteralEquivInst::Print
                          ((MatchLiteralEquivInst *)pSStack_50,w,local_8e8,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case MatchTrie:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_910 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_910 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = MatchTrieInst::Print((MatchTrieInst *)pSStack_50,w,local_910,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case OptMatchChar:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_938 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_938 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = OptMatchCharInst::Print((OptMatchCharInst *)pSStack_50,w,local_938,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case OptMatchSet:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_960 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_960 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = OptMatchSetInst::Print((OptMatchSetInst *)pSStack_50,w,local_960,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case SyncToCharAndContinue:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_988 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_988 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = SyncToCharAndContinueInst::Print
                          ((SyncToCharAndContinueInst *)pSStack_50,w,local_988,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case SyncToChar2SetAndContinue:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_9b0 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_9b0 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = SyncToChar2SetAndContinueInst::Print
                          ((SyncToChar2SetAndContinueInst *)pSStack_50,w,local_9b0,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case SyncToSetAndContinue:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_9d8 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_9d8 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = SyncToSetAndContinueInst<false>::Print
                          ((SyncToSetAndContinueInst<false> *)pSStack_50,w,local_9d8,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case SyncToNegatedSetAndContinue:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_a00 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_a00 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = SyncToSetAndContinueInst<true>::Print
                          ((SyncToSetAndContinueInst<true> *)pSStack_50,w,local_a00,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case SyncToChar2LiteralAndContinue:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_a28 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_a28 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = SyncToLiteralAndContinueInstT<UnifiedRegex::Char2LiteralScannerMixin>::Print
                          ((SyncToLiteralAndContinueInstT<UnifiedRegex::Char2LiteralScannerMixin> *)
                           pSStack_50,w,local_a28,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case SyncToLiteralAndContinue:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_a50 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_a50 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = SyncToLiteralAndContinueInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
                ::Print((SyncToLiteralAndContinueInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
                         *)pSStack_50,w,local_a50,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case SyncToLinearLiteralAndContinue:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_a78 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_a78 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = SyncToLiteralAndContinueInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
                ::Print((SyncToLiteralAndContinueInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
                         *)pSStack_50,w,local_a78,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case SyncToLiteralEquivAndContinue:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_aa0 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_aa0 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = SyncToLiteralAndContinueInstT<UnifiedRegex::EquivScannerMixinT<4U>_>::Print
                          ((SyncToLiteralAndContinueInstT<UnifiedRegex::EquivScannerMixinT<4U>_> *)
                           pSStack_50,w,local_aa0,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case SyncToLiteralEquivTrivialLastPatCharAndContinue:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_ac8 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_ac8 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = SyncToLiteralAndContinueInstT<UnifiedRegex::EquivScannerMixinT<1U>_>::Print
                          ((SyncToLiteralAndContinueInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                           pSStack_50,w,local_ac8,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case SyncToCharAndConsume:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_af0 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_af0 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = SyncToCharAndConsumeInst::Print
                          ((SyncToCharAndConsumeInst *)pSStack_50,w,local_af0,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case SyncToChar2SetAndConsume:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_b18 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_b18 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = SyncToChar2SetAndConsumeInst::Print
                          ((SyncToChar2SetAndConsumeInst *)pSStack_50,w,local_b18,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case SyncToSetAndConsume:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_b40 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_b40 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = SyncToSetAndConsumeInst<false>::Print
                          ((SyncToSetAndConsumeInst<false> *)pSStack_50,w,local_b40,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case SyncToNegatedSetAndConsume:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_b68 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_b68 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = SyncToSetAndConsumeInst<true>::Print
                          ((SyncToSetAndConsumeInst<true> *)pSStack_50,w,local_b68,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case SyncToChar2LiteralAndConsume:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_b90 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_b90 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = SyncToLiteralAndConsumeInstT<UnifiedRegex::Char2LiteralScannerMixin>::Print
                          ((SyncToLiteralAndConsumeInstT<UnifiedRegex::Char2LiteralScannerMixin> *)
                           pSStack_50,w,local_b90,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case SyncToLiteralAndConsume:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_bb8 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_bb8 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = SyncToLiteralAndConsumeInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
                ::Print((SyncToLiteralAndConsumeInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
                         *)pSStack_50,w,local_bb8,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case SyncToLinearLiteralAndConsume:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_be0 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_be0 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = SyncToLiteralAndConsumeInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
                ::Print((SyncToLiteralAndConsumeInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
                         *)pSStack_50,w,local_be0,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case SyncToLiteralEquivAndConsume:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_c08 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_c08 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = SyncToLiteralAndConsumeInstT<UnifiedRegex::EquivScannerMixinT<4U>_>::Print
                          ((SyncToLiteralAndConsumeInstT<UnifiedRegex::EquivScannerMixinT<4U>_> *)
                           pSStack_50,w,local_c08,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case SyncToLiteralEquivTrivialLastPatCharAndConsume:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_c30 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_c30 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = SyncToLiteralAndConsumeInstT<UnifiedRegex::EquivScannerMixinT<1U>_>::Print
                          ((SyncToLiteralAndConsumeInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                           pSStack_50,w,local_c30,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case SyncToCharAndBackup:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_c58 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_c58 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = SyncToCharAndBackupInst::Print
                          ((SyncToCharAndBackupInst *)pSStack_50,w,local_c58,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case SyncToSetAndBackup:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_c80 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_c80 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = SyncToSetAndBackupInst<false>::Print
                          ((SyncToSetAndBackupInst<false> *)pSStack_50,w,local_c80,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case SyncToNegatedSetAndBackup:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_ca8 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_ca8 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = SyncToSetAndBackupInst<true>::Print
                          ((SyncToSetAndBackupInst<true> *)pSStack_50,w,local_ca8,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case SyncToChar2LiteralAndBackup:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_cd0 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_cd0 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = SyncToLiteralAndBackupInstT<UnifiedRegex::Char2LiteralScannerMixin>::Print
                          ((SyncToLiteralAndBackupInstT<UnifiedRegex::Char2LiteralScannerMixin> *)
                           pSStack_50,w,local_cd0,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case SyncToLiteralAndBackup:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_cf8 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_cf8 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = SyncToLiteralAndBackupInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
                ::Print((SyncToLiteralAndBackupInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
                         *)pSStack_50,w,local_cf8,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case SyncToLinearLiteralAndBackup:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_d20 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_d20 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = SyncToLiteralAndBackupInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
                ::Print((SyncToLiteralAndBackupInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
                         *)pSStack_50,w,local_d20,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case SyncToLiteralEquivAndBackup:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_d48 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_d48 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<4U>_>::Print
                          ((SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<4U>_> *)
                           pSStack_50,w,local_d48,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case SyncToLiteralEquivTrivialLastPatCharAndBackup:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_d70 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_d70 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_>::Print
                          (pSStack_50,w,local_d70,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case SyncToLiteralsAndBackup:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_d98 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_d98 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = SyncToLiteralsAndBackupInst::Print
                          ((SyncToLiteralsAndBackupInst *)pSStack_50,w,local_d98,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case MatchGroup:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_dc0 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_dc0 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = MatchGroupInst::Print((MatchGroupInst *)pSStack_50,w,local_dc0,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case BeginDefineGroup:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_de8 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_de8 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = BeginDefineGroupInst::Print((BeginDefineGroupInst *)pSStack_50,w,local_de8,*ppcVar8)
        ;
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case EndDefineGroup:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_e10 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_e10 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = EndDefineGroupInst::Print((EndDefineGroupInst *)pSStack_50,w,local_e10,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case DefineGroupFixed:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_e38 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_e38 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = DefineGroupFixedInst::Print((DefineGroupFixedInst *)pSStack_50,w,local_e38,*ppcVar8)
        ;
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case BeginLoop:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_e60 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_e60 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = BeginLoopInst::Print((BeginLoopInst *)pSStack_50,w,local_e60,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case RepeatLoop:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_e88 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_e88 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = RepeatLoopInst::Print((RepeatLoopInst *)pSStack_50,w,local_e88,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case BeginLoopIfChar:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_eb0 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_eb0 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = BeginLoopIfCharInst::Print((BeginLoopIfCharInst *)pSStack_50,w,local_eb0,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case BeginLoopIfSet:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_ed8 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_ed8 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = BeginLoopIfSetInst::Print((BeginLoopIfSetInst *)pSStack_50,w,local_ed8,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case RepeatLoopIfChar:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_f00 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_f00 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = RepeatLoopIfCharInst::Print((RepeatLoopIfCharInst *)pSStack_50,w,local_f00,*ppcVar8)
        ;
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case RepeatLoopIfSet:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_f28 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_f28 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = RepeatLoopIfSetInst::Print((RepeatLoopIfSetInst *)pSStack_50,w,local_f28,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case BeginLoopFixed:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_f50 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_f50 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = BeginLoopFixedInst::Print((BeginLoopFixedInst *)pSStack_50,w,local_f50,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case RepeatLoopFixed:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_f78 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_f78 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = RepeatLoopFixedInst::Print((RepeatLoopFixedInst *)pSStack_50,w,local_f78,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case LoopSet:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_fa0 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_fa0 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = LoopSetInst::Print((LoopSetInst *)pSStack_50,w,local_fa0,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case LoopSetWithFollowFirst:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_fc8 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_fc8 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = LoopSetWithFollowFirstInst::Print
                          ((LoopSetWithFollowFirstInst *)pSStack_50,w,local_fc8,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case BeginLoopFixedGroupLastIteration:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_ff0 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_ff0 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = BeginLoopFixedGroupLastIterationInst::Print
                          ((BeginLoopFixedGroupLastIterationInst *)pSStack_50,w,local_ff0,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case RepeatLoopFixedGroupLastIteration:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_1018 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_1018 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = RepeatLoopFixedGroupLastIterationInst::Print
                          ((RepeatLoopFixedGroupLastIterationInst *)pSStack_50,w,local_1018,*ppcVar8
                          );
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case BeginGreedyLoopNoBacktrack:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_1040 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_1040 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = BeginGreedyLoopNoBacktrackInst::Print
                          ((BeginGreedyLoopNoBacktrackInst *)pSStack_50,w,local_1040,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case RepeatGreedyLoopNoBacktrack:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_1068 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_1068 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = RepeatGreedyLoopNoBacktrackInst::Print
                          ((RepeatGreedyLoopNoBacktrackInst *)pSStack_50,w,local_1068,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case ChompCharStar:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_1090 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_1090 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = ChompCharInst<(UnifiedRegex::ChompMode)0>::Print
                          ((ChompCharInst<(UnifiedRegex::ChompMode)0> *)pSStack_50,w,local_1090,
                           *ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case ChompCharPlus:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_10b8 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_10b8 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = ChompCharInst<(UnifiedRegex::ChompMode)1>::Print
                          ((ChompCharInst<(UnifiedRegex::ChompMode)1> *)pSStack_50,w,local_10b8,
                           *ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case ChompSetStar:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_10e0 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_10e0 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = ChompSetInst<(UnifiedRegex::ChompMode)0>::Print
                          ((ChompSetInst<(UnifiedRegex::ChompMode)0> *)pSStack_50,w,local_10e0,
                           *ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case ChompSetPlus:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_1108 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_1108 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = ChompSetInst<(UnifiedRegex::ChompMode)1>::Print
                          ((ChompSetInst<(UnifiedRegex::ChompMode)1> *)pSStack_50,w,local_1108,
                           *ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case ChompCharGroupStar:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_1130 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_1130 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = ChompCharGroupInst<(UnifiedRegex::ChompMode)0>::Print
                          ((ChompCharGroupInst<(UnifiedRegex::ChompMode)0> *)pSStack_50,w,local_1130
                           ,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case ChompCharGroupPlus:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_1158 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_1158 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = ChompCharGroupInst<(UnifiedRegex::ChompMode)1>::Print
                          ((ChompCharGroupInst<(UnifiedRegex::ChompMode)1> *)pSStack_50,w,local_1158
                           ,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case ChompSetGroupStar:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_1180 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_1180 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = ChompSetGroupInst<(UnifiedRegex::ChompMode)0>::Print
                          ((ChompSetGroupInst<(UnifiedRegex::ChompMode)0> *)pSStack_50,w,local_1180,
                           *ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case ChompSetGroupPlus:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_11a8 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_11a8 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = ChompSetGroupInst<(UnifiedRegex::ChompMode)1>::Print
                          ((ChompSetGroupInst<(UnifiedRegex::ChompMode)1> *)pSStack_50,w,local_11a8,
                           *ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case ChompCharBounded:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_11d0 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_11d0 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = ChompCharBoundedInst::Print
                          ((ChompCharBoundedInst *)pSStack_50,w,local_11d0,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case ChompSetBounded:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_11f8 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_11f8 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = ChompSetBoundedInst::Print((ChompSetBoundedInst *)pSStack_50,w,local_11f8,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case ChompSetBoundedGroupLastChar:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_1220 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_1220 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = ChompSetBoundedGroupLastCharInst::Print
                          ((ChompSetBoundedGroupLastCharInst *)pSStack_50,w,local_1220,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case Try:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_1248 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_1248 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = TryInst::Print((TryInst *)pSStack_50,w,local_1248,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case TryIfChar:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_1270 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_1270 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = TryIfCharInst::Print((TryIfCharInst *)pSStack_50,w,local_1270,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case TryMatchChar:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_1298 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_1298 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = TryMatchCharInst::Print((TryMatchCharInst *)pSStack_50,w,local_1298,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case TryIfSet:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_12c0 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_12c0 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = TryIfSetInst::Print((TryIfSetInst *)pSStack_50,w,local_12c0,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case TryMatchSet:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_12e8 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_12e8 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = TryMatchSetInst::Print((TryMatchSetInst *)pSStack_50,w,local_12e8,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case BeginAssertion:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_1310 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_1310 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = BeginAssertionInst::Print((BeginAssertionInst *)pSStack_50,w,local_1310,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      case EndAssertion:
        if (bVar5 == 0) {
          ppuVar9 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                              ((WriteBarrierPtr *)&(this->rep).insts);
          local_1338 = iVar7 - (int)*ppuVar9;
        }
        else {
          local_1338 = inst._4_4_;
          inst._4_4_ = inst._4_4_ + 1;
        }
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&(this->rep).insts.litbuf);
        iVar7 = EndAssertionInst::Print((EndAssertionInst *)pSStack_50,w,local_1338,*ppcVar8);
        pSStack_50 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                     ((long)(pSStack_50->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + (long)iVar7 + -0x11);
        break;
      default:
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                           ,0x16bb,"(false)","false");
        if (!bVar6) {
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 0;
      }
    }
    DebugWriter::Unindent(w);
    DebugWriter::PrintEOL(w,L"}");
    break;
  case SingleCharTag:
    DebugWriter::Print(w,L"special form: <match single char ");
    DebugWriter::PrintQuotedChar(w,(this->rep).singleChar.c);
    DebugWriter::PrintEOL(w,L">");
    break;
  case BoundedWordTag:
    DebugWriter::PrintEOL(w,L"special form: <match bounded word>");
    break;
  case LeadingTrailingSpacesTag:
    DebugWriter::PrintEOL
              (w,L"special form: <match leading/trailing spaces: minBegin=%d minEnd=%d>",
               (ulong)(this->rep).boiLiteral2.literal,
               (ulong)(this->rep).leadingTrailingSpaces.endMinMatch);
    break;
  case OctoquadTag:
    DebugWriter::Print(w,L"special form: <octoquad ");
    this_00 = Memory::WriteBarrierPtr<UnifiedRegex::OctoquadMatcher>::operator->
                        ((WriteBarrierPtr<UnifiedRegex::OctoquadMatcher> *)&(this->rep).insts);
    OctoquadMatcher::Print(this_00,w);
    DebugWriter::PrintEOL(w,L">");
  }
  DebugWriter::Unindent(w);
  DebugWriter::PrintEOL(w,L"}");
  return;
}

Assistant:

void Program::Print(DebugWriter* w)
    {
        const bool isBaselineMode = Js::Configuration::Global.flags.BaselineMode;
        w->PrintEOL(_u("Program {"));
        w->Indent();
        w->PrintEOL(_u("source:       %s"), PointerValue(source));

        w->Print(_u("litbuf:       "));
        const char16 *litbuf = this->rep.insts.litbuf;
        size_t litbufLen = 0;
        if (litbuf == nullptr)
        {
            w->PrintEOL(_u("<NONE>"));
        }
        else
        {
            litbufLen = this->rep.insts.litbufLen;
            for (size_t i = 0; i < litbufLen; ++i)
            {
                const char16 c = (char16)litbuf[i];
                w->PrintEscapedChar(c);
            }
            w->PrintEOL(_u(""));
        }
        w->PrintEOL(_u("litbufLen:    %u"), litbufLen);

        w->Print(_u("flags:        "));
        if ((flags & GlobalRegexFlag) != 0) w->Print(_u("global "));
        if ((flags & MultilineRegexFlag) != 0) w->Print(_u("multiline "));
        if ((flags & IgnoreCaseRegexFlag) != 0) w->Print(_u("ignorecase "));
        if ((flags & DotAllRegexFlag) != 0) w->Print(_u("dotAll "));
        if ((flags & UnicodeRegexFlag) != 0) w->Print(_u("unicode "));
        if ((flags & StickyRegexFlag) != 0) w->Print(_u("sticky "));
        w->EOL();
        w->PrintEOL(_u("numGroups:    %d"), numGroups);
        w->PrintEOL(_u("numLoops:     %d"), numLoops);
        switch (tag)
        {
        case ProgramTag::BOIInstructionsTag:
        case ProgramTag::InstructionsTag:
            {
                w->PrintEOL(_u("instructions: {"));
                w->Indent();
                if (tag == ProgramTag::BOIInstructionsTag)
                {
                    w->PrintEOL(_u("       BOITest(hardFail: true)"));
                }
                uint8* instsLim = rep.insts.insts + rep.insts.instsLen;
                uint8* curr = rep.insts.insts;
                int i = 0;
                while (curr != instsLim)
                {
                    const Inst *inst = (const Inst*)curr;
                    switch (inst->tag)
                    {
#define MBase(TagName, ClassName) \
                    case Inst::InstTag::TagName: \
                    { \
                        const ClassName *actualInst = static_cast<const ClassName *>(inst); \
                        curr += actualInst->Print(w, (Label)(isBaselineMode ? i++ : curr - rep.insts.insts), rep.insts.litbuf); \
                        break; \
                    }
#define M(TagName) MBase(TagName, TagName##Inst)
#define MTemplate(TagName, TemplateDeclaration, GenericClassName, SpecializedClassName) MBase(TagName, SpecializedClassName)
#include "RegexOpCodes.h"
#undef MBase
#undef M
#undef MTemplate
                    default:
                        Assert(false);
                        __assume(false);
                    }
                }
                w->Unindent();
                w->PrintEOL(_u("}"));
            }
            break;
        case ProgramTag::SingleCharTag:
            w->Print(_u("special form: <match single char "));
            w->PrintQuotedChar(rep.singleChar.c);
            w->PrintEOL(_u(">"));
            break;
        case ProgramTag::BoundedWordTag:
            w->PrintEOL(_u("special form: <match bounded word>"));
            break;
        case ProgramTag::LeadingTrailingSpacesTag:
            w->PrintEOL(_u("special form: <match leading/trailing spaces: minBegin=%d minEnd=%d>"),
                rep.leadingTrailingSpaces.beginMinMatch, rep.leadingTrailingSpaces.endMinMatch);
            break;
        case ProgramTag::OctoquadTag:
            w->Print(_u("special form: <octoquad "));
            rep.octoquad.matcher->Print(w);
            w->PrintEOL(_u(">"));
            break;
        }
        w->Unindent();
        w->PrintEOL(_u("}"));
    }